

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_reader.cpp
# Opt level: O2

unique_ptr<duckdb::ParquetColumnSchema,_std::default_delete<duckdb::ParquetColumnSchema>,_true>
__thiscall duckdb::ParquetReader::ParseSchema(ParquetReader *this)

{
  bool bVar1;
  FileMetaData *pFVar2;
  const_reference pvVar3;
  BinderException *this_00;
  IOException *pIVar4;
  InvalidInputException *this_01;
  ParquetReader *in_RSI;
  pointer pPVar5;
  allocator local_161;
  idx_t next_file_idx;
  idx_t next_schema_idx;
  ParquetColumnSchema local_150;
  ParquetColumnSchema root;
  
  pFVar2 = GetFileMetadata(in_RSI);
  next_schema_idx = 0;
  next_file_idx = 0;
  if ((pFVar2->schema).
      super_vector<duckdb_parquet::SchemaElement,_std::allocator<duckdb_parquet::SchemaElement>_>.
      super__Vector_base<duckdb_parquet::SchemaElement,_std::allocator<duckdb_parquet::SchemaElement>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (pFVar2->schema).
      super_vector<duckdb_parquet::SchemaElement,_std::allocator<duckdb_parquet::SchemaElement>_>.
      super__Vector_base<duckdb_parquet::SchemaElement,_std::allocator<duckdb_parquet::SchemaElement>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pIVar4 = (IOException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&root,"Parquet reader: no schema elements found",(allocator *)&local_150);
    IOException::IOException(pIVar4,(string *)&root);
    __cxa_throw(pIVar4,&IOException::typeinfo,::std::runtime_error::~runtime_error);
  }
  pvVar3 = vector<duckdb_parquet::SchemaElement,_true>::get<true>(&pFVar2->schema,0);
  if (pvVar3->num_children != 0) {
    ParseSchemaRecursive(&root,in_RSI,0,0,0,&next_schema_idx,&next_file_idx);
    if (root.type.id_ != STRUCT) {
      this_01 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&local_150,"Root element of Parquet file must be a struct",&local_161);
      InvalidInputException::InvalidInputException(this_01,(string *)&local_150);
      __cxa_throw(this_01,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
    if ((in_RSI->parquet_options).file_row_number == true) {
      pPVar5 = root.children.
               super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
               .
               super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
               ._M_impl.super__Vector_impl_data._M_start;
      while (pPVar5 != root.children.
                       super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
                       .
                       super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
                       ._M_impl.super__Vector_impl_data._M_finish) {
        ::std::__cxx11::string::string((string *)&local_150,"file_row_number",&local_161);
        bVar1 = StringUtil::CIEquals(&pPVar5->name,(string *)&local_150);
        ::std::__cxx11::string::~string((string *)&local_150);
        pPVar5 = pPVar5 + 1;
        if (bVar1) {
          this_00 = (BinderException *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::string::string
                    ((string *)&local_150,
                     "Using file_row_number option on file with column named file_row_number is not supported"
                     ,&local_161);
          BinderException::BinderException(this_00,(string *)&local_150);
          __cxa_throw(this_00,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
        }
      }
      FileRowNumberSchema();
      ::std::vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>::
      emplace_back<duckdb::ParquetColumnSchema>
                (&root.children.
                  super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
                 ,&local_150);
      ParquetColumnSchema::~ParquetColumnSchema(&local_150);
    }
    make_uniq<duckdb::ParquetColumnSchema,duckdb::ParquetColumnSchema&>((duckdb *)this,&root);
    ParquetColumnSchema::~ParquetColumnSchema(&root);
    return (unique_ptr<duckdb::ParquetColumnSchema,_std::default_delete<duckdb::ParquetColumnSchema>_>
            )(unique_ptr<duckdb::ParquetColumnSchema,_std::default_delete<duckdb::ParquetColumnSchema>_>
              )this;
  }
  pIVar4 = (IOException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&root,"Parquet reader: root schema element has no children",
             (allocator *)&local_150);
  IOException::IOException(pIVar4,(string *)&root);
  __cxa_throw(pIVar4,&IOException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

unique_ptr<ParquetColumnSchema> ParquetReader::ParseSchema() {
	auto file_meta_data = GetFileMetadata();
	idx_t next_schema_idx = 0;
	idx_t next_file_idx = 0;

	if (file_meta_data->schema.empty()) {
		throw IOException("Parquet reader: no schema elements found");
	}
	if (file_meta_data->schema[0].num_children == 0) {
		throw IOException("Parquet reader: root schema element has no children");
	}
	auto root = ParseSchemaRecursive(0, 0, 0, next_schema_idx, next_file_idx);
	if (root.type.id() != LogicalTypeId::STRUCT) {
		throw InvalidInputException("Root element of Parquet file must be a struct");
	}
	D_ASSERT(next_schema_idx == file_meta_data->schema.size() - 1);
	D_ASSERT(file_meta_data->row_groups.empty() || next_file_idx == file_meta_data->row_groups[0].columns.size());
	if (parquet_options.file_row_number) {
		for (auto &column : root.children) {
			auto &name = column.name;
			if (StringUtil::CIEquals(name, "file_row_number")) {
				throw BinderException(
				    "Using file_row_number option on file with column named file_row_number is not supported");
			}
		}
		root.children.push_back(FileRowNumberSchema());
	}
	return make_uniq<ParquetColumnSchema>(root);
}